

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O0

optional_idx __thiscall duckdb::StandardBufferManager::GetMaxSwap(StandardBufferManager *this)

{
  bool bVar1;
  lock_guard<std::mutex> guard;
  TemporaryFileManager *in_stack_ffffffffffffffb8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  optional_idx local_8;
  
  ::std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffffc0,(mutex_type *)in_stack_ffffffffffffffb8);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
                      *)0xc51747);
  if (bVar1) {
    unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
    ::operator->((unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
                  *)in_stack_ffffffffffffffc0);
    TemporaryDirectoryHandle::GetTempFile((TemporaryDirectoryHandle *)0xc5179a);
    local_8 = TemporaryFileManager::GetMaxSwapSpace(in_stack_ffffffffffffffb8);
  }
  else {
    optional_idx::optional_idx(&local_8);
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xc517cc);
  return (optional_idx)local_8.index;
}

Assistant:

optional_idx StandardBufferManager::GetMaxSwap() const {
	lock_guard<mutex> guard(temporary_directory.lock);
	if (!temporary_directory.handle) {
		return optional_idx();
	}
	return temporary_directory.handle->GetTempFile().GetMaxSwapSpace();
}